

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::fixBlockUniformLayoutMatrix
          (TParseContext *this,TQualifier *qualifier,TTypeList *originTypeList,
          TTypeList *tmpTypeList)

{
  _Vector_impl_data *p_Var1;
  _Vector_impl_data *p_Var2;
  pointer pTVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TQualifier *qualifier_00;
  TType *this_00;
  TTypeList *originTypeList_00;
  TTypeList *tmpTypeList_00;
  TQualifier *s;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  TParseContext *this_01;
  void *in_R8;
  uint uVar7;
  ulong uVar8;
  _Vector_impl_data *p_Var9;
  _Vector_impl_data *local_60;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  if ((tmpTypeList != (TTypeList *)0x0) &&
     ((long)(originTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(originTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
      (long)(tmpTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(tmpTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    __assert_fail("tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x2685,
                  "void glslang::TParseContext::fixBlockUniformLayoutMatrix(TQualifier &, TTypeList *, TTypeList *)"
                 );
  }
  p_Var1 = &(originTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data;
  p_Var2 = &(tmpTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data;
  uVar7 = 0;
  s = qualifier;
  do {
    uVar8 = (ulong)uVar7;
    pTVar3 = (originTypeList->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(originTypeList->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 5) <= uVar8) {
      return;
    }
    if ((qualifier->field_0x10 & 0xf) != 0) {
      if (tmpTypeList == (TTypeList *)0x0) {
        iVar5 = (*(pTVar3[uVar8].type)->_vptr_TType[0x1c])();
        p_Var9 = p_Var1;
        if ((char)iVar5 == '\0') {
          iVar5 = (*(p_Var1->_M_start[uVar8].type)->_vptr_TType[7])();
          goto joined_r0x003b0e27;
        }
      }
      else {
        iVar5 = (*(p_Var2->_M_start[uVar8].type)->_vptr_TType[0x1c])();
        p_Var9 = p_Var2;
        if ((char)iVar5 == '\0') {
          iVar5 = (*(p_Var2->_M_start[uVar8].type)->_vptr_TType[7])();
joined_r0x003b0e27:
          if (iVar5 != 0xf) goto LAB_003b0e83;
        }
      }
      iVar5 = (*(p_Var9->_M_start[uVar8].type)->_vptr_TType[10])();
      if (*(ulong *)(CONCAT44(extraout_var,iVar5) + 8) < 0x2000000000000000) {
        uVar4 = *(ulong *)&qualifier->field_0x8;
        iVar5 = (*(p_Var9->_M_start[uVar8].type)->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_00,iVar5) + 8) =
             *(ulong *)(CONCAT44(extraout_var_00,iVar5) + 8) & 0x1fffffffffffffff |
             uVar4 & 0xe000000000000000;
      }
    }
LAB_003b0e83:
    iVar5 = (*(p_Var1->_M_start[uVar8].type)->_vptr_TType[7])();
    if (iVar5 == 0xf) {
      iVar6 = (*(p_Var1->_M_start[uVar8].type)->_vptr_TType[10])();
      iVar5 = 0;
      __child_stack = extraout_RDX;
      qualifier_00 = qualifier;
      if (0x1fffffffffffffff < *(ulong *)(CONCAT44(extraout_var_01,iVar6) + 8)) {
        iVar5 = 0;
        iVar6 = (*(p_Var1->_M_start[uVar8].type)->_vptr_TType[10])();
        qualifier_00 = (TQualifier *)CONCAT44(extraout_var_02,iVar6);
        __child_stack = extraout_RDX_00;
      }
      if (tmpTypeList == (TTypeList *)0x0) {
        iVar5 = TType::clone(p_Var1->_M_start[uVar8].type,(__fn *)s,__child_stack,iVar5,in_R8);
        this_00 = (TType *)CONCAT44(extraout_var_03,iVar5);
        local_60 = p_Var1;
      }
      else {
        this_00 = p_Var2->_M_start[uVar8].type;
        local_60 = p_Var2;
      }
      originTypeList_00 = TType::getWritableStruct(p_Var1->_M_start[uVar8].type);
      tmpTypeList_00 = TType::getWritableStruct(this_00);
      this_01 = this;
      fixBlockUniformLayoutMatrix(this,qualifier_00,originTypeList_00,tmpTypeList_00);
      s = (TQualifier *)
          recordStructCopy(this_01,&this->matrixFixRecord,p_Var1->_M_start[uVar8].type,this_00);
      TType::setStruct(local_60->_M_start[uVar8].type,(TTypeList *)s);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TParseContext::fixBlockUniformLayoutMatrix(TQualifier& qualifier, TTypeList* originTypeList,
                                                TTypeList* tmpTypeList)
{
    assert(tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size());
    for (unsigned int member = 0; member < originTypeList->size(); ++member) {
        if (qualifier.layoutPacking != ElpNone) {
            if (tmpTypeList == nullptr) {
                if (((*originTypeList)[member].type->isMatrix() ||
                     (*originTypeList)[member].type->getBasicType() == EbtStruct) &&
                    (*originTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                    (*originTypeList)[member].type->getQualifier().layoutMatrix = qualifier.layoutMatrix;
                }
            } else {
                if (((*tmpTypeList)[member].type->isMatrix() ||
                     (*tmpTypeList)[member].type->getBasicType() == EbtStruct) &&
                    (*tmpTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                    (*tmpTypeList)[member].type->getQualifier().layoutMatrix = qualifier.layoutMatrix;
                }
            }
        }

        if ((*originTypeList)[member].type->getBasicType() == EbtStruct) {
            TQualifier* memberQualifier = nullptr;
            // block member can be declare a matrix style, so it should be update to the member's style
            if ((*originTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                memberQualifier = &qualifier;
            } else {
                memberQualifier = &((*originTypeList)[member].type->getQualifier());
            }

            const TType* tmpType = tmpTypeList == nullptr ?
                (*originTypeList)[member].type->clone() : (*tmpTypeList)[member].type;

            fixBlockUniformLayoutMatrix(*memberQualifier, (*originTypeList)[member].type->getWritableStruct(),
                                        tmpType->getWritableStruct());

            const TTypeList* structure = recordStructCopy(matrixFixRecord, (*originTypeList)[member].type, tmpType);

            if (tmpTypeList == nullptr) {
                (*originTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
            if (tmpTypeList != nullptr) {
                (*tmpTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
        }
    }
}